

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O3

Abc_Cex_t * Abc_CexTransformTempor(Abc_Cex_t *p,int nPisOld,int nPosOld,int nRegsOld)

{
  int iVar1;
  int iVar2;
  Abc_Cex_t *pAVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  bool bVar8;
  
  iVar1 = p->iFrame;
  iVar2 = p->nPis;
  iVar5 = iVar2 / nPisOld;
  if (iVar1 < 1) {
    __assert_fail("p->iFrame > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilCex.c"
                  ,0x1af,"Abc_Cex_t *Abc_CexTransformTempor(Abc_Cex_t *, int, int, int)");
  }
  if (iVar2 % nPisOld == 0) {
    uVar7 = (iVar5 + iVar1) * nPisOld + nRegsOld;
    pAVar3 = (Abc_Cex_t *)
             calloc(1,(long)(int)((((int)uVar7 >> 5) + 1) - (uint)((uVar7 & 0x1f) == 0)) * 4 + 0x14)
    ;
    pAVar3->nRegs = nRegsOld;
    pAVar3->nPis = nPisOld;
    pAVar3->nBits = uVar7;
    pAVar3->iPo = p->iPo;
    pAVar3->iFrame = iVar5 + -1 + iVar1;
    if (1 < iVar5) {
      iVar4 = 0;
      do {
        iVar4 = iVar4 + 1;
        if (0 < nPisOld) {
          uVar7 = iVar4 * nPisOld + p->nRegs;
          iVar6 = nPisOld;
          do {
            if (((uint)(&p[1].iPo)[(int)uVar7 >> 5] >> (uVar7 & 0x1f) & 1) != 0) {
              (&pAVar3[1].iPo)[nRegsOld >> 5] =
                   (&pAVar3[1].iPo)[nRegsOld >> 5] | 1 << ((byte)nRegsOld & 0x1f);
            }
            nRegsOld = nRegsOld + 1;
            uVar7 = uVar7 + 1;
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
        }
      } while (iVar4 != iVar5 + -1);
    }
    iVar4 = 0;
    iVar5 = 0;
    do {
      if (0 < nPisOld) {
        uVar7 = p->nRegs + iVar4;
        iVar6 = nPisOld;
        do {
          if (((uint)(&p[1].iPo)[(int)uVar7 >> 5] >> (uVar7 & 0x1f) & 1) != 0) {
            (&pAVar3[1].iPo)[nRegsOld >> 5] =
                 (&pAVar3[1].iPo)[nRegsOld >> 5] | 1 << ((byte)nRegsOld & 0x1f);
          }
          nRegsOld = nRegsOld + 1;
          uVar7 = uVar7 + 1;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      iVar4 = iVar4 + iVar2;
      bVar8 = iVar5 != iVar1;
      iVar5 = iVar5 + 1;
    } while (bVar8);
    if (nRegsOld == pAVar3->nBits) {
      return pAVar3;
    }
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilCex.c"
                  ,0x1bc,"Abc_Cex_t *Abc_CexTransformTempor(Abc_Cex_t *, int, int, int)");
  }
  __assert_fail("p->nPis % nPisOld == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilCex.c"
                ,0x1b0,"Abc_Cex_t *Abc_CexTransformTempor(Abc_Cex_t *, int, int, int)");
}

Assistant:

Abc_Cex_t * Abc_CexTransformTempor( Abc_Cex_t * p, int nPisOld, int nPosOld, int nRegsOld )
{
    Abc_Cex_t * pCex;
    int i, k, iBit = nRegsOld, nFrames = p->nPis / nPisOld - 1;
    assert( p->iFrame > 0 ); // otherwise tempor did not properly check for failures in the prefix
    assert( p->nPis % nPisOld == 0 );
    pCex = Abc_CexAlloc( nRegsOld, nPisOld, nFrames + p->iFrame + 1 );
    pCex->iPo    = p->iPo;
    pCex->iFrame = nFrames + p->iFrame;
    for ( i = 0; i < nFrames; i++ )
        for ( k = 0; k < nPisOld; k++, iBit++ )
            if ( Abc_InfoHasBit(p->pData, p->nRegs + (i+1)*nPisOld + k) )
                Abc_InfoSetBit( pCex->pData, iBit );
    for ( i = 0; i <= p->iFrame; i++ )
        for ( k = 0; k < nPisOld; k++, iBit++ )
            if ( Abc_InfoHasBit(p->pData, p->nRegs + i*p->nPis + k) )
                Abc_InfoSetBit( pCex->pData, iBit );
    assert( iBit == pCex->nBits );
    return pCex;
}